

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int ActualMain(char *filename)

{
  byte bVar1;
  ostream *poVar2;
  int exitCode;
  ifstream input;
  ifstream local_280 [8];
  ifstream prelude;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [8];
  string prelude_file;
  Sexp *local_28;
  Sexp *activation;
  FrameProtector __frame_prot;
  char *filename_local;
  
  __frame_prot.protected_frame = (Frame *)filename;
  FrameProtector::FrameProtector((FrameProtector *)&activation,"ActualMain");
  local_28 = (Sexp *)0x0;
  FrameProtector::ProtectValue((FrameProtector *)&activation,&local_28,"activation");
  g_global_activation = GcHeap::AllocateActivation((Sexp *)0x0);
  local_28 = g_global_activation;
  FrameProtector::ProtectValue
            ((FrameProtector *)&activation,&g_global_activation,"g_global_activation");
  LoadBuiltins(local_28);
  std::operator+(local_78,-0x40);
  std::operator+(local_58,(char *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::ifstream::ifstream(local_280,local_58,8);
  std::ifstream::ifstream(&exitCode,0x16bfe0,8);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    bVar1 = std::ios::fail();
    if ((bVar1 & 1) == 0) {
      filename_local._4_4_ = EvalFile(local_280,local_28);
      if (filename_local._4_4_ == 0) {
        filename_local._4_4_ = EvalFile((ifstream *)&exitCode,local_28);
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"failed to open file: ");
      poVar2 = std::operator<<(poVar2,(char *)__frame_prot.protected_frame);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      filename_local._4_4_ = 1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"failed to open prelude (");
    poVar2 = std::operator<<(poVar2,(string *)local_58);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    filename_local._4_4_ = 1;
  }
  std::ifstream::~ifstream(&exitCode);
  std::ifstream::~ifstream(local_280);
  std::__cxx11::string::~string((string *)local_58);
  FrameProtector::~FrameProtector((FrameProtector *)&activation);
  return filename_local._4_4_;
}

Assistant:

int ActualMain(char *filename) {
  GC_HELPER_FRAME;
  GC_PROTECTED_LOCAL(activation);

  activation = GcHeap::AllocateActivation(nullptr);
  g_global_activation = activation;
  GC_PROTECT(g_global_activation);
  LoadBuiltins(activation);

  std::string prelude_file = g_options.stdlib_path + path_sep + "prelude.jet";
  std::ifstream prelude(prelude_file);
  std::ifstream input(g_options.input_file);

  if (prelude.fail()) {
    std::cerr << "failed to open prelude (" << prelude_file << ")" << std::endl;
    return 1;
  }

  if (input.fail()) {
    std::cerr << "failed to open file: " << filename << std::endl;
    return 1;
  }

  int exitCode = EvalFile(prelude, activation);
  if (exitCode != 0) {
    return exitCode;
  }

  return EvalFile(input, activation);
}